

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteFieldDocComment
               (Printer *printer,FieldDescriptor *field,Options *options,bool kdoc)

{
  string_view text;
  string_view text_00;
  Options OStack_c8;
  Options local_78;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  Options::Options(&local_78,options);
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(printer,field,&local_78,kdoc);
  Options::~Options(&local_78);
  Options::Options(&OStack_c8,options);
  WriteDebugString(printer,field,&OStack_c8,kdoc);
  Options::~Options(&OStack_c8);
  text_00._M_str = " */\n";
  text_00._M_len = 4;
  io::Printer::Print<>(printer,text_00);
  return;
}

Assistant:

void WriteFieldDocComment(io::Printer* printer, const FieldDescriptor* field,
                          const Options options, const bool kdoc) {
  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then continue with the field declaration,
  // e.g.:
  //   optional string foo = 5;
  // And then we end with the javadoc tags if applicable.
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field, options, kdoc);
  WriteDebugString(printer, field, options, kdoc);
  printer->Print(" */\n");
}